

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObject.cpp
# Opt level: O0

void __thiscall Js::DynamicObject::Mark(DynamicObject *this,Recycler *recycler)

{
  DynamicType *this_00;
  DynamicTypeHandler *this_01;
  size_t sVar1;
  void **objEnd;
  void **obj;
  size_t objectSize;
  size_t inlineSlotsSize;
  Recycler *recycler_local;
  DynamicObject *this_local;
  
  if ((DAT_01ebb8c3 & 1) == 0) {
    RecyclableObject::Mark(&this->super_RecyclableObject,recycler);
  }
  else {
    this_00 = GetDynamicType(this);
    this_01 = DynamicType::GetTypeHandler(this_00);
    sVar1 = DynamicTypeHandler::GetInlineSlotsSize(this_01);
    objEnd = (void **)this;
    do {
      Memory::Recycler::TryMarkNonInterior(recycler,*objEnd,(void *)0x0);
      objEnd = objEnd + 1;
    } while (objEnd != (void **)((long)&(this->super_RecyclableObject).super_FinalizableObject.
                                        super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject +
                                (sVar1 + 0x20 & 0xfffffffffffffff8)));
  }
  return;
}

Assistant:

void DynamicObject::Mark(Recycler *recycler)
    {
        // If -RecyclerTrackStress is enabled, DynamicObject will be allocated as Track (and thus Finalize too).
        // Process the mark now.

        if (Js::Configuration::Global.flags.RecyclerTrackStress)
        {
            size_t inlineSlotsSize = this->GetDynamicType()->GetTypeHandler()->GetInlineSlotsSize();
            size_t objectSize = sizeof(DynamicObject) + inlineSlotsSize;
            void ** obj = (void **)this;
            void ** objEnd = obj + (objectSize / sizeof(void *));

            do
            {
                recycler->TryMarkNonInterior(*obj, nullptr);
                obj++;
            } while (obj != objEnd);

            return;
        }

        RecyclableObject::Mark(recycler);
    }